

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O0

void __thiscall wasm::InstrumentLocals::visitModule(InstrumentLocals *this,Module *curr)

{
  initializer_list<wasm::Type> types;
  Name name;
  initializer_list<wasm::Type> types_00;
  Name name_00;
  initializer_list<wasm::Type> types_01;
  Name name_01;
  initializer_list<wasm::Type> types_02;
  Name name_02;
  initializer_list<wasm::Type> types_03;
  Name name_03;
  initializer_list<wasm::Type> types_04;
  Name name_04;
  initializer_list<wasm::Type> types_05;
  Name name_05;
  initializer_list<wasm::Type> types_06;
  Name name_06;
  initializer_list<wasm::Type> types_07;
  Name name_07;
  initializer_list<wasm::Type> types_08;
  Name name_08;
  initializer_list<wasm::Type> types_09;
  Name name_09;
  initializer_list<wasm::Type> types_10;
  Name name_10;
  initializer_list<wasm::Type> types_11;
  Name name_11;
  initializer_list<wasm::Type> types_12;
  Name name_12;
  Module *pMVar1;
  bool bVar2;
  Type local_428;
  Type local_420;
  undefined8 local_418;
  undefined8 local_410;
  iterator local_408;
  undefined8 local_400;
  Type local_3f8;
  size_t local_3f0;
  char *local_3e8;
  Type local_3e0;
  Type local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  iterator local_3c0;
  undefined8 local_3b8;
  Type local_3b0;
  size_t local_3a8;
  char *local_3a0;
  uintptr_t local_398;
  Type local_390;
  Type TStack_388;
  uintptr_t local_380;
  iterator local_378;
  undefined8 local_370;
  Type local_368;
  size_t local_360;
  char *local_358;
  uintptr_t local_350;
  Type local_348;
  Type TStack_340;
  uintptr_t local_338;
  iterator local_330;
  undefined8 local_328;
  Type local_320;
  size_t local_318;
  char *local_310;
  uintptr_t local_308;
  Type local_300;
  Type TStack_2f8;
  uintptr_t local_2f0;
  iterator local_2e8;
  undefined8 local_2e0;
  Type local_2d8;
  size_t local_2d0;
  char *local_2c8;
  uintptr_t local_2c0;
  Type local_2b8;
  Type TStack_2b0;
  uintptr_t local_2a8;
  iterator local_2a0;
  undefined8 local_298;
  Type local_290;
  size_t local_288;
  char *local_280;
  HeapType local_278;
  Type local_270;
  Type ext;
  Type local_260;
  Type func;
  Type local_250;
  undefined8 local_248;
  undefined8 local_240;
  iterator local_238;
  undefined8 local_230;
  Type local_228;
  size_t local_220;
  char *local_218;
  Type local_210;
  Type local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  iterator local_1f0;
  undefined8 local_1e8;
  Type local_1e0;
  size_t local_1d8;
  char *local_1d0;
  Type local_1c8;
  Type local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  iterator local_1a8;
  undefined8 local_1a0;
  Type local_198;
  size_t local_190;
  char *local_188;
  Type local_180;
  Type local_178;
  undefined8 local_170;
  undefined8 local_168;
  iterator local_160;
  undefined8 local_158;
  Type local_150;
  size_t local_148;
  char *local_140;
  Type local_138;
  Type local_130;
  undefined8 local_128;
  undefined8 local_120;
  iterator local_118;
  undefined8 local_110;
  Type local_108;
  size_t local_100;
  char *local_f8;
  Type local_f0;
  Type local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  iterator local_d0;
  undefined8 local_c8;
  Type local_c0;
  size_t local_b8;
  char *local_b0;
  Type local_a8;
  Type local_a0;
  undefined8 local_98;
  undefined8 local_90;
  iterator local_88;
  undefined8 local_80;
  Type local_78;
  size_t local_70;
  char *local_68;
  Type local_60;
  Type local_58;
  undefined8 local_50;
  undefined8 local_48;
  iterator local_40;
  undefined8 local_38;
  Type local_30;
  size_t local_28;
  char *local_20;
  Module *local_18;
  Module *curr_local;
  InstrumentLocals *this_local;
  
  local_28 = get_i32;
  local_20 = DAT_027e51d8;
  local_58.id = 2;
  local_50 = 2;
  local_48 = 2;
  local_40 = &local_58;
  local_38 = 3;
  types_12._M_len = 3;
  types_12._M_array = local_40;
  local_18 = curr;
  curr_local = (Module *)this;
  wasm::Type::Type(&local_30,types_12);
  wasm::Type::Type(&local_60,i32);
  name_12.super_IString.str._M_str = local_20;
  name_12.super_IString.str._M_len = local_28;
  addImport(this,curr,name_12,local_30,local_60);
  pMVar1 = local_18;
  local_70 = get_i64;
  local_68 = DAT_027e51e8;
  local_a0.id = 2;
  local_98 = 2;
  local_90 = 3;
  local_88 = &local_a0;
  local_80 = 3;
  types_11._M_len = 3;
  types_11._M_array = local_88;
  wasm::Type::Type(&local_78,types_11);
  wasm::Type::Type(&local_a8,i64);
  name_11.super_IString.str._M_str = local_68;
  name_11.super_IString.str._M_len = local_70;
  addImport(this,pMVar1,name_11,local_78,local_a8);
  pMVar1 = local_18;
  local_b8 = get_f32;
  local_b0 = DAT_027e51f8;
  local_e8.id = 2;
  local_e0 = 2;
  local_d8 = 4;
  local_d0 = &local_e8;
  local_c8 = 3;
  types_10._M_len = 3;
  types_10._M_array = local_d0;
  wasm::Type::Type(&local_c0,types_10);
  wasm::Type::Type(&local_f0,f32);
  name_10.super_IString.str._M_str = local_b0;
  name_10.super_IString.str._M_len = local_b8;
  addImport(this,pMVar1,name_10,local_c0,local_f0);
  pMVar1 = local_18;
  local_100 = get_f64;
  local_f8 = DAT_027e5208;
  local_130.id = 2;
  local_128 = 2;
  local_120 = 5;
  local_118 = &local_130;
  local_110 = 3;
  types_09._M_len = 3;
  types_09._M_array = local_118;
  wasm::Type::Type(&local_108,types_09);
  wasm::Type::Type(&local_138,f64);
  name_09.super_IString.str._M_str = local_f8;
  name_09.super_IString.str._M_len = local_100;
  addImport(this,pMVar1,name_09,local_108,local_138);
  pMVar1 = local_18;
  local_148 = set_i32;
  local_140 = DAT_027e5248;
  local_178.id = 2;
  local_170 = 2;
  local_168 = 2;
  local_160 = &local_178;
  local_158 = 3;
  types_08._M_len = 3;
  types_08._M_array = local_160;
  wasm::Type::Type(&local_150,types_08);
  wasm::Type::Type(&local_180,i32);
  name_08.super_IString.str._M_str = local_140;
  name_08.super_IString.str._M_len = local_148;
  addImport(this,pMVar1,name_08,local_150,local_180);
  pMVar1 = local_18;
  local_190 = set_i64;
  local_188 = DAT_027e5258;
  local_1c0.id = 2;
  local_1b8 = 2;
  local_1b0 = 3;
  local_1a8 = &local_1c0;
  local_1a0 = 3;
  types_07._M_len = 3;
  types_07._M_array = local_1a8;
  wasm::Type::Type(&local_198,types_07);
  wasm::Type::Type(&local_1c8,i64);
  name_07.super_IString.str._M_str = local_188;
  name_07.super_IString.str._M_len = local_190;
  addImport(this,pMVar1,name_07,local_198,local_1c8);
  pMVar1 = local_18;
  local_1d8 = set_f32;
  local_1d0 = DAT_027e5268;
  local_208.id = 2;
  local_200 = 2;
  local_1f8 = 4;
  local_1f0 = &local_208;
  local_1e8 = 3;
  types_06._M_len = 3;
  types_06._M_array = local_1f0;
  wasm::Type::Type(&local_1e0,types_06);
  wasm::Type::Type(&local_210,f32);
  name_06.super_IString.str._M_str = local_1d0;
  name_06.super_IString.str._M_len = local_1d8;
  addImport(this,pMVar1,name_06,local_1e0,local_210);
  pMVar1 = local_18;
  local_220 = set_f64;
  local_218 = DAT_027e5278;
  local_250.id = 2;
  local_248 = 2;
  local_240 = 5;
  local_238 = &local_250;
  local_230 = 3;
  types_05._M_len = 3;
  types_05._M_array = local_238;
  wasm::Type::Type(&local_228,types_05);
  wasm::Type::Type(&func,f64);
  name_05.super_IString.str._M_str = local_218;
  name_05.super_IString.str._M_len = local_220;
  addImport(this,pMVar1,name_05,local_228,func);
  bVar2 = FeatureSet::hasReferenceTypes(&local_18->features);
  if (bVar2) {
    HeapType::HeapType((HeapType *)&ext,func);
    wasm::Type::Type(&local_260,(HeapType)ext.id,Nullable);
    HeapType::HeapType(&local_278,ext);
    wasm::Type::Type(&local_270,local_278,Nullable);
    pMVar1 = local_18;
    local_288 = get_funcref;
    local_280 = DAT_027e5228;
    wasm::Type::Type(&local_2b8,i32);
    wasm::Type::Type(&TStack_2b0,i32);
    local_2a8 = local_260.id;
    local_2a0 = &local_2b8;
    local_298 = 3;
    types_04._M_len = 3;
    types_04._M_array = local_2a0;
    wasm::Type::Type(&local_290,types_04);
    local_2c0 = local_260.id;
    name_04.super_IString.str._M_str = local_280;
    name_04.super_IString.str._M_len = local_288;
    addImport(this,pMVar1,name_04,local_290,local_260);
    pMVar1 = local_18;
    local_2d0 = set_funcref;
    local_2c8 = DAT_027e5298;
    wasm::Type::Type(&local_300,i32);
    wasm::Type::Type(&TStack_2f8,i32);
    local_2f0 = local_260.id;
    local_2e8 = &local_300;
    local_2e0 = 3;
    types_03._M_len = 3;
    types_03._M_array = local_2e8;
    wasm::Type::Type(&local_2d8,types_03);
    local_308 = local_260.id;
    name_03.super_IString.str._M_str = local_2c8;
    name_03.super_IString.str._M_len = local_2d0;
    addImport(this,pMVar1,name_03,local_2d8,local_260);
    pMVar1 = local_18;
    local_318 = get_externref;
    local_310 = DAT_027e5238;
    wasm::Type::Type(&local_348,i32);
    wasm::Type::Type(&TStack_340,i32);
    local_338 = local_270.id;
    local_330 = &local_348;
    local_328 = 3;
    types_02._M_len = 3;
    types_02._M_array = local_330;
    wasm::Type::Type(&local_320,types_02);
    local_350 = local_270.id;
    name_02.super_IString.str._M_str = local_310;
    name_02.super_IString.str._M_len = local_318;
    addImport(this,pMVar1,name_02,local_320,local_270);
    pMVar1 = local_18;
    local_360 = set_externref;
    local_358 = DAT_027e52a8;
    wasm::Type::Type(&local_390,i32);
    wasm::Type::Type(&TStack_388,i32);
    local_380 = local_270.id;
    local_378 = &local_390;
    local_370 = 3;
    types_01._M_len = 3;
    types_01._M_array = local_378;
    wasm::Type::Type(&local_368,types_01);
    local_398 = local_270.id;
    name_01.super_IString.str._M_str = local_358;
    name_01.super_IString.str._M_len = local_360;
    addImport(this,pMVar1,name_01,local_368,local_270);
  }
  bVar2 = FeatureSet::hasSIMD(&local_18->features);
  pMVar1 = local_18;
  if (bVar2) {
    local_3a8 = get_v128;
    local_3a0 = DAT_027e5218;
    local_3d8.id = 2;
    local_3d0 = 2;
    local_3c8 = 6;
    local_3c0 = &local_3d8;
    local_3b8 = 3;
    types_00._M_len = 3;
    types_00._M_array = local_3c0;
    wasm::Type::Type(&local_3b0,types_00);
    wasm::Type::Type(&local_3e0,v128);
    name_00.super_IString.str._M_str = local_3a0;
    name_00.super_IString.str._M_len = local_3a8;
    addImport(this,pMVar1,name_00,local_3b0,local_3e0);
    pMVar1 = local_18;
    local_3f0 = set_v128;
    local_3e8 = DAT_027e5288;
    local_420.id = 2;
    local_418 = 2;
    local_410 = 6;
    local_408 = &local_420;
    local_400 = 3;
    types._M_len = 3;
    types._M_array = local_408;
    wasm::Type::Type(&local_3f8,types);
    wasm::Type::Type(&local_428,v128);
    name.super_IString.str._M_str = local_3e8;
    name.super_IString.str._M_len = local_3f0;
    addImport(this,pMVar1,name,local_3f8,local_428);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    addImport(curr, get_i32, {Type::i32, Type::i32, Type::i32}, Type::i32);
    addImport(curr, get_i64, {Type::i32, Type::i32, Type::i64}, Type::i64);
    addImport(curr, get_f32, {Type::i32, Type::i32, Type::f32}, Type::f32);
    addImport(curr, get_f64, {Type::i32, Type::i32, Type::f64}, Type::f64);
    addImport(curr, set_i32, {Type::i32, Type::i32, Type::i32}, Type::i32);
    addImport(curr, set_i64, {Type::i32, Type::i32, Type::i64}, Type::i64);
    addImport(curr, set_f32, {Type::i32, Type::i32, Type::f32}, Type::f32);
    addImport(curr, set_f64, {Type::i32, Type::i32, Type::f64}, Type::f64);

    if (curr->features.hasReferenceTypes()) {
      Type func = Type(HeapType::func, Nullable);
      Type ext = Type(HeapType::ext, Nullable);

      addImport(curr, get_funcref, {Type::i32, Type::i32, func}, func);
      addImport(curr, set_funcref, {Type::i32, Type::i32, func}, func);
      addImport(curr, get_externref, {Type::i32, Type::i32, ext}, ext);
      addImport(curr, set_externref, {Type::i32, Type::i32, ext}, ext);
    }
    if (curr->features.hasSIMD()) {
      addImport(curr, get_v128, {Type::i32, Type::i32, Type::v128}, Type::v128);
      addImport(curr, set_v128, {Type::i32, Type::i32, Type::v128}, Type::v128);
    }
  }